

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-death.c
# Opt level: O0

void death_file(char *title,wchar_t row)

{
  _Bool _Var1;
  char local_468 [7];
  _Bool success;
  char ftmp [80];
  char buf [1024];
  wchar_t row_local;
  char *title_local;
  
  player_safe_name(local_468,0x50,player->full_name,false);
  my_strcat(local_468,".txt",0x50);
  _Var1 = (*get_file)(local_468,ftmp + 0x48,0x400);
  if (_Var1) {
    screen_save();
    _Var1 = dump_save(ftmp + 0x48);
    screen_load();
    if (_Var1) {
      msg("Character dump successful.");
    }
    else {
      msg("Character dump failed!");
    }
    event_signal(EVENT_MESSAGE_FLUSH);
  }
  return;
}

Assistant:

static void death_file(const char *title, int row)
{
	char buf[1024];
	char ftmp[80];

	/* Get the filesystem-safe name and append .txt */
	player_safe_name(ftmp, sizeof(ftmp), player->full_name, false);
	my_strcat(ftmp, ".txt", sizeof(ftmp));

	if (get_file(ftmp, buf, sizeof buf)) {
		bool success;

		/* Dump a character file */
		screen_save();
		success = dump_save(buf);
		screen_load();

		/* Check result */
		if (success)
			msg("Character dump successful.");
		else
			msg("Character dump failed!");

		/* Flush messages */
		event_signal(EVENT_MESSAGE_FLUSH);
	}
}